

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char[8]>(XmlWriter *this,string *name,char (*attribute) [8])

{
  XmlWriter *pXVar1;
  string local_60;
  undefined1 local_30 [8];
  ReusableStringStream rss;
  char (*attribute_local) [8];
  string *name_local;
  XmlWriter *this_local;
  
  rss.m_oss = (ostream *)attribute;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_30);
  ReusableStringStream::operator<<((ReusableStringStream *)local_30,(char (*) [8])rss.m_oss);
  ReusableStringStream::str_abi_cxx11_(&local_60,(ReusableStringStream *)local_30);
  pXVar1 = writeAttribute(this,name,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_30);
  return pXVar1;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }